

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O1

void __thiscall
slang::ast::CoverpointSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (CoverpointSymbol *this,CheckerMemberVisitor *visitor)

{
  size_t sVar1;
  Expression *pEVar2;
  CoverageOptionSetter *opt;
  pointer this_00;
  long lVar3;
  
  pEVar2 = DeclaredType::getInitializer(&this->declaredType);
  if (pEVar2 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  pEVar2 = getIffExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  sVar1 = (this->options)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    this_00 = (this->options)._M_ptr;
    lVar3 = sVar1 * 0x18;
    do {
      pEVar2 = CoverageOptionSetter::getExpression(this_00);
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                (pEVar2,pEVar2,visitor);
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (auto expr = declaredType.getInitializer())
            expr->visit(visitor);

        if (auto expr = getIffExpr())
            expr->visit(visitor);

        for (auto& opt : options)
            opt.visitExprs(visitor);
    }